

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.h
# Opt level: O2

RABlock * __thiscall
asmjit::v1_14::ZoneStack<asmjit::v1_14::RABlock_*>::popFirst
          (ZoneStack<asmjit::v1_14::RABlock_*> *this)

{
  long lVar1;
  undefined8 *puVar2;
  RABlock *pRVar3;
  bool bVar4;
  
  if (*(long *)this == 0) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/zonestack.h"
               ,0xc3,"isInitialized()");
  }
  bVar4 = ZoneStackBase::empty(&this->super_ZoneStackBase);
  if (!bVar4) {
    lVar1 = *(long *)&this->field_0x8;
    puVar2 = *(undefined8 **)(lVar1 + 0x10);
    if (puVar2 != *(undefined8 **)(lVar1 + 0x18)) {
      pRVar3 = (RABlock *)*puVar2;
      *(undefined8 **)(lVar1 + 0x10) = puVar2 + 1;
      if (puVar2 + 1 == *(undefined8 **)(lVar1 + 0x18)) {
        ZoneStackBase::_cleanupBlock(&this->super_ZoneStackBase,0,0x110);
      }
      return pRVar3;
    }
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/zonestack.h"
               ,199,"!block->empty()");
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/zonestack.h"
             ,0xc4,"!empty()");
}

Assistant:

inline T popFirst() noexcept {
    ASMJIT_ASSERT(isInitialized());
    ASMJIT_ASSERT(!empty());

    Block* block = _block[kBlockIndexFirst];
    ASMJIT_ASSERT(!block->empty());

    T* ptr = block->start<T>();
    T item = *ptr++;

    block->setStart(ptr);
    if (block->empty())
      _cleanupBlock(kBlockIndexFirst, kMidBlockIndex);

    return item;
  }